

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgument::FollowsGroup(cmCommandArgument *this,cmCommandArgumentGroup *group)

{
  const_iterator __first;
  const_iterator __last;
  cmCommandArgumentGroup *group_local;
  cmCommandArgument *this_local;
  
  if (group != (cmCommandArgumentGroup *)0x0) {
    this->ArgumentsBeforeEmpty = false;
    __first = std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::begin
                        (&group->ContainedArguments);
    __last = std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::end
                       (&group->ContainedArguments);
    std::
    set<cmCommandArgument_const*,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
    ::
    insert<__gnu_cxx::__normal_iterator<cmCommandArgument*const*,std::vector<cmCommandArgument*,std::allocator<cmCommandArgument*>>>>
              ((set<cmCommandArgument_const*,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
                *)&this->ArgumentsBefore,
               (__normal_iterator<cmCommandArgument_*const_*,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                )__first._M_current,
               (__normal_iterator<cmCommandArgument_*const_*,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                )__last._M_current);
  }
  return;
}

Assistant:

void cmCommandArgument::FollowsGroup(const cmCommandArgumentGroup* group)
{
  if (group != nullptr) {
    this->ArgumentsBeforeEmpty = false;
    this->ArgumentsBefore.insert(group->ContainedArguments.begin(),
                                 group->ContainedArguments.end());
  }
}